

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * anon_unknown.dwarf_1ba5289::AddChecksum(string *str)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Span<const_char> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  __lhs = in_RDI;
  std::operator+(in_RDI,(char *)in_RSI);
  Span<char_const>::Span<std::__cxx11::string>
            ((Span<const_char> *)this,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  (anonymous_namespace)::DescriptorChecksum_abi_cxx11_(in_stack_00000008);
  std::operator+(__lhs,in_RSI);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string AddChecksum(const std::string& str) { return str + "#" + DescriptorChecksum(str); }